

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer.h
# Opt level: O1

size_t __thiscall
threadsafe::ring_buffer<sig::ProtoSignal<void_()>::Link>::size
          (ring_buffer<sig::ProtoSignal<void_()>::Link> *this)

{
  Node<sig::ProtoSignal<void_()>::Link> *this_00;
  Node<sig::ProtoSignal<void_()>::Link> *this_01;
  size_t sVar1;
  
  this_01 = (this->root_).next;
  impl::Node<sig::ProtoSignal<void_()>::Link>::inc_ref(this_01);
  sVar1 = 0;
  while( true ) {
    impl::Node<sig::ProtoSignal<void_()>::Link>::inc_ref(&this->root_);
    impl::Node<sig::ProtoSignal<void_()>::Link>::dec_ref(&this->root_);
    if (this_01 == &this->root_) break;
    this_00 = this_01->next;
    impl::Node<sig::ProtoSignal<void_()>::Link>::inc_ref(this_00);
    sVar1 = sVar1 + 1;
    impl::Node<sig::ProtoSignal<void_()>::Link>::dec_ref(this_01);
    this_01 = this_00;
  }
  impl::Node<sig::ProtoSignal<void_()>::Link>::dec_ref(this_01);
  return sVar1;
}

Assistant:

size_t size() const {
        size_t i = 0;
        for(auto it = begin(); it != end(); ++it) {
            ++i;
        }
        return i;
    }